

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

long duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<float,long>
               (float input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  undefined8 in_RDX;
  VectorTryCastData *data;
  long output;
  float in_stack_0000017c;
  long *in_stack_ffffffffffffff88;
  VectorTryCastData *cast_data;
  idx_t in_stack_ffffffffffffff90;
  ValidityMask *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  VectorTryCastData local_58;
  undefined8 local_38;
  long local_30;
  undefined8 local_28;
  long local_8;
  
  local_28 = in_RDX;
  bVar1 = NumericTryCast::Operation<float,long>
                    ((float)(in_stack_ffffffffffffff90 >> 0x20),in_stack_ffffffffffffff88,false);
  if (bVar1) {
    local_8 = local_30;
  }
  else {
    local_38 = local_28;
    cast_data = &local_58;
    CastExceptionText<float,long>(in_stack_0000017c);
    local_8 = HandleVectorCastError::Operation<long>
                        (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                         in_stack_ffffffffffffff90,cast_data);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  return local_8;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}